

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O3

longlong mg_store_body(mg_connection *conn,char *path)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  size_t sVar5;
  mg_file *in_RCX;
  char *in_RDX;
  mg_file_stat *filep;
  ulong __n;
  longlong lVar6;
  mg_file fi;
  char buf [8192];
  char local_2068 [32];
  FILE *local_2048;
  mg_connection *local_2040;
  mg_connection local_2038 [3];
  
  if (conn->consumed_content == 0) {
    local_2068[0x10] = '\0';
    local_2068[0x11] = '\0';
    local_2068[0x12] = '\0';
    local_2068[0x13] = '\0';
    local_2068[0x14] = '\0';
    local_2068[0x15] = '\0';
    local_2068[0x16] = '\0';
    local_2068[0x17] = '\0';
    local_2068[0x18] = '\0';
    local_2068[0x19] = '\0';
    local_2068[0x1a] = '\0';
    local_2068[0x1b] = '\0';
    local_2068[0x1c] = '\0';
    local_2068[0x1d] = '\0';
    local_2068[0x1e] = '\0';
    local_2068[0x1f] = '\0';
    local_2068[0] = '\0';
    local_2068[1] = '\0';
    local_2068[2] = '\0';
    local_2068[3] = '\0';
    local_2068[4] = '\0';
    local_2068[5] = '\0';
    local_2068[6] = '\0';
    local_2068[7] = '\0';
    local_2068[8] = '\0';
    local_2068[9] = '\0';
    local_2068[10] = '\0';
    local_2068[0xb] = '\0';
    local_2068[0xc] = '\0';
    local_2068[0xd] = '\0';
    local_2068[0xe] = '\0';
    local_2068[0xf] = '\0';
    local_2048 = (FILE *)0x0;
    pcVar4 = strchr(path + 2,0x2f);
    if (pcVar4 != (char *)0x0) {
      bVar1 = true;
      local_2040 = conn;
      do {
        __n = (long)pcVar4 - (long)path;
        if (0xfff < __n) {
          return -1;
        }
        memcpy(local_2038,path,__n);
        *(undefined1 *)((long)local_2038 + __n) = 0;
        iVar2 = mg_stat(local_2038,local_2068,filep);
        if ((iVar2 == 0) && (iVar2 = mkdir((char *)local_2038,0x1ed), iVar2 != 0)) {
          return -2;
        }
        if (pcVar4[1] == '\0') {
          bVar1 = false;
        }
        pcVar4 = strchr(pcVar4 + 1,0x2f);
      } while (pcVar4 != (char *)0x0);
      conn = local_2040;
      if (!bVar1) {
        return 0;
      }
    }
    iVar2 = mg_fopen((mg_connection *)path,(char *)0x2,(int)local_2068,in_RCX);
    if (iVar2 == 0) {
      lVar6 = -0xc;
    }
    else {
      uVar3 = mg_read(conn,local_2038,0x2000);
      if ((int)uVar3 < 1) {
        lVar6 = 0;
      }
      else {
        lVar6 = 0;
        do {
          sVar5 = fwrite(local_2038,1,(ulong)uVar3,local_2048);
          if (uVar3 != (uint)sVar5) {
            if (local_2048 != (FILE *)0x0) {
              fclose(local_2048);
            }
            local_2048 = (FILE *)0x0;
            remove_bad_file(conn,path);
            return -0xd;
          }
          lVar6 = lVar6 + (ulong)uVar3;
          uVar3 = mg_read(conn,local_2038,0x2000);
        } while (0 < (int)uVar3);
      }
      if ((local_2048 == (FILE *)0x0) || (iVar2 = fclose(local_2048), iVar2 != 0)) {
        local_2048 = (FILE *)0x0;
        remove_bad_file(conn,path);
        lVar6 = -0xe;
      }
    }
  }
  else {
    mg_cry_internal_wrap
              (conn,(mg_context *)0x0,in_RDX,(uint)in_RCX,"%s: Contents already consumed",
               "mg_store_body");
    lVar6 = -0xb;
  }
  return lVar6;
}

Assistant:

CIVETWEB_API long long
mg_store_body(struct mg_connection *conn, const char *path)
{
	char buf[MG_BUF_LEN];
	long long len = 0;
	int ret, n;
	struct mg_file fi;

	if (conn->consumed_content != 0) {
		mg_cry_internal(conn, "%s: Contents already consumed", __func__);
		return -11;
	}

	ret = put_dir(conn, path);
	if (ret < 0) {
		/* -1 for path too long,
		 * -2 for path can not be created. */
		return ret;
	}
	if (ret != 1) {
		/* Return 0 means, path itself is a directory. */
		return 0;
	}

	if (mg_fopen(conn, path, MG_FOPEN_MODE_WRITE, &fi) == 0) {
		return -12;
	}

	ret = mg_read(conn, buf, sizeof(buf));
	while (ret > 0) {
		n = (int)fwrite(buf, 1, (size_t)ret, fi.access.fp);
		if (n != ret) {
			(void)mg_fclose(
			    &fi.access); /* File is bad and will be removed anyway. */
			remove_bad_file(conn, path);
			return -13;
		}
		len += ret;
		ret = mg_read(conn, buf, sizeof(buf));
	}

	/* File is open for writing. If fclose fails, there was probably an
	 * error flushing the buffer to disk, so the file on disk might be
	 * broken. Delete it and return an error to the caller. */
	if (mg_fclose(&fi.access) != 0) {
		remove_bad_file(conn, path);
		return -14;
	}

	return len;
}